

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshManipulator.cpp
# Opt level: O2

SMesh * __thiscall irr::scene::CMeshManipulator::createMeshCopy(CMeshManipulator *this,IMesh *mesh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  SMesh *this_00;
  undefined4 extraout_var;
  CMeshBuffer<irr::video::S3DVertex> *this_01;
  SMaterial *pSVar7;
  S3DVertex *element;
  S3DVertex2TCoords *element_00;
  S3DVertexTangents *element_01;
  unsigned_short *puVar8;
  undefined8 *puVar9;
  ulong uVar10;
  u32 b;
  uint uVar11;
  bool bVar12;
  long *plVar6;
  undefined4 extraout_var_00;
  
  uVar11 = 0;
  if (mesh == (IMesh *)0x0) {
    this_00 = (SMesh *)0x0;
  }
  else {
    this_00 = (SMesh *)operator_new(0x58);
    SMesh::SMesh(this_00);
    uVar3 = (**mesh->_vptr_IMesh)(mesh);
    for (; uVar11 != uVar3; uVar11 = uVar11 + 1) {
      iVar4 = (*mesh->_vptr_IMesh[1])(mesh,(ulong)uVar11);
      plVar6 = (long *)CONCAT44(extraout_var,iVar4);
      iVar4 = (**(code **)(*plVar6 + 0x10))(plVar6);
      if (iVar4 == 2) {
        this_01 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
        CMeshBuffer<irr::video::S3DVertexTangents>::CMeshBuffer
                  ((CMeshBuffer<irr::video::S3DVertexTangents> *)this_01);
        pSVar7 = (SMaterial *)(**(code **)(*plVar6 + 8))(plVar6);
        video::SMaterial::operator=(&this_01->Material,pSVar7);
        uVar5 = (**(code **)(*plVar6 + 0x28))(plVar6);
        core::array<irr::video::S3DVertexTangents>::reallocate
                  ((array<irr::video::S3DVertexTangents> *)&this_01->Vertices,uVar5,true);
        element_01 = (S3DVertexTangents *)(**(code **)(*plVar6 + 0x18))(plVar6);
        uVar10 = (ulong)uVar5;
        while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
          core::array<irr::video::S3DVertexTangents>::push_back
                    ((array<irr::video::S3DVertexTangents> *)&this_01->Vertices,element_01);
          element_01 = element_01 + 1;
        }
        uVar5 = (**(code **)(*plVar6 + 0x48))(plVar6);
        core::array<unsigned_short>::reallocate(&this_01->Indices,uVar5,true);
        puVar8 = (unsigned_short *)(**(code **)(*plVar6 + 0x38))(plVar6);
        uVar10 = (ulong)uVar5;
        while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
          core::array<unsigned_short>::push_back(&this_01->Indices,puVar8);
          puVar8 = puVar8 + 1;
        }
LAB_001e5006:
        SMesh::addMeshBuffer(this_00,&this_01->super_IMeshBuffer);
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   ((this_01->super_IMeshBuffer)._vptr_IMeshBuffer[-3] + -0x20 +
                   (long)&(this_01->Material).TextureLayers[0].Texture));
      }
      else {
        if (iVar4 == 1) {
          this_01 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
          CMeshBuffer<irr::video::S3DVertex2TCoords>::CMeshBuffer
                    ((CMeshBuffer<irr::video::S3DVertex2TCoords> *)this_01);
          pSVar7 = (SMaterial *)(**(code **)(*plVar6 + 8))(plVar6);
          video::SMaterial::operator=(&this_01->Material,pSVar7);
          uVar5 = (**(code **)(*plVar6 + 0x28))(plVar6);
          core::array<irr::video::S3DVertex2TCoords>::reallocate
                    ((array<irr::video::S3DVertex2TCoords> *)&this_01->Vertices,uVar5,true);
          element_00 = (S3DVertex2TCoords *)(**(code **)(*plVar6 + 0x18))(plVar6);
          uVar10 = (ulong)uVar5;
          while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
            core::array<irr::video::S3DVertex2TCoords>::push_back
                      ((array<irr::video::S3DVertex2TCoords> *)&this_01->Vertices,element_00);
            element_00 = element_00 + 1;
          }
          uVar5 = (**(code **)(*plVar6 + 0x48))(plVar6);
          core::array<unsigned_short>::reallocate(&this_01->Indices,uVar5,true);
          puVar8 = (unsigned_short *)(**(code **)(*plVar6 + 0x38))(plVar6);
          uVar10 = (ulong)uVar5;
          while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
            core::array<unsigned_short>::push_back(&this_01->Indices,puVar8);
            puVar8 = puVar8 + 1;
          }
          goto LAB_001e5006;
        }
        if (iVar4 == 0) {
          this_01 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
          CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(this_01);
          pSVar7 = (SMaterial *)(**(code **)(*plVar6 + 8))(plVar6);
          video::SMaterial::operator=(&this_01->Material,pSVar7);
          uVar5 = (**(code **)(*plVar6 + 0x28))(plVar6);
          core::array<irr::video::S3DVertex>::reallocate(&this_01->Vertices,uVar5,true);
          element = (S3DVertex *)(**(code **)(*plVar6 + 0x18))(plVar6);
          uVar10 = (ulong)uVar5;
          while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
            core::array<irr::video::S3DVertex>::push_back(&this_01->Vertices,element);
            element = element + 1;
          }
          uVar5 = (**(code **)(*plVar6 + 0x48))(plVar6);
          core::array<unsigned_short>::reallocate(&this_01->Indices,uVar5,true);
          puVar8 = (unsigned_short *)(**(code **)(*plVar6 + 0x38))(plVar6);
          uVar10 = (ulong)uVar5;
          while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
            core::array<unsigned_short>::push_back(&this_01->Indices,puVar8);
            puVar8 = puVar8 + 1;
          }
          goto LAB_001e5006;
        }
      }
    }
    iVar4 = (*mesh->_vptr_IMesh[3])(mesh);
    puVar9 = (undefined8 *)CONCAT44(extraout_var_00,iVar4);
    uVar1 = *puVar9;
    uVar2 = puVar9[1];
    (this_00->BoundingBox).MinEdge.X = (float)(int)uVar1;
    (this_00->BoundingBox).MinEdge.Y = (float)(int)((ulong)uVar1 >> 0x20);
    *(undefined8 *)&(this_00->BoundingBox).MinEdge.Z = uVar2;
    uVar1 = puVar9[2];
    (this_00->BoundingBox).MaxEdge.Y = (float)(int)uVar1;
    (this_00->BoundingBox).MaxEdge.Z = (float)(int)((ulong)uVar1 >> 0x20);
  }
  return this_00;
}

Assistant:

SMesh *CMeshManipulator::createMeshCopy(scene::IMesh *mesh) const
{
	if (!mesh)
		return 0;

	SMesh *clone = new SMesh();

	const u32 meshBufferCount = mesh->getMeshBufferCount();

	for (u32 b = 0; b < meshBufferCount; ++b) {
		const IMeshBuffer *const mb = mesh->getMeshBuffer(b);
		switch (mb->getVertexType()) {
		case video::EVT_STANDARD: {
			SMeshBuffer *buffer = new SMeshBuffer();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertex *vertices = (video::S3DVertex *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		case video::EVT_2TCOORDS: {
			SMeshBufferLightMap *buffer = new SMeshBufferLightMap();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertex2TCoords *vertices = (video::S3DVertex2TCoords *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		case video::EVT_TANGENTS: {
			SMeshBufferTangents *buffer = new SMeshBufferTangents();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertexTangents *vertices = (video::S3DVertexTangents *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		} // end switch

	} // end for all mesh buffers

	clone->BoundingBox = mesh->getBoundingBox();
	return clone;
}